

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O2

void anon_unknown.dwarf_fc64a::trimString(string *str)

{
  long lVar1;
  allocator<char> local_31;
  string spaceChars;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&spaceChars," \f\n\r\t\v",&local_31);
  std::__cxx11::string::find_first_not_of((string *)str,(ulong)&spaceChars);
  std::__cxx11::string::erase((ulong)str,0);
  lVar1 = std::__cxx11::string::find_last_not_of((string *)str,(ulong)&spaceChars);
  if (lVar1 != -1) {
    std::__cxx11::string::erase((ulong)str,lVar1 + 1);
  }
  std::__cxx11::string::~string((string *)&spaceChars);
  return;
}

Assistant:

void trimString(string& str)
{
  string spaceChars = " \f\n\r\t\v";
  size_t pos = str.find_first_not_of(spaceChars);
  str.erase(0, pos);

  pos = str.find_last_not_of(spaceChars);
  if (pos != string::npos)
    str.erase(pos + 1);
}